

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_number_toString(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  int iVar1;
  int iVar2;
  JSValueUnion JVar3;
  uint uVar4;
  ulong uVar5;
  JSRefCountHeader *p_1;
  uint32_t tag;
  uint uVar6;
  int64_t iVar7;
  JSValue JVar8;
  JSValue JVar9;
  JSValue val;
  int radix;
  int local_3c;
  JSValueUnion local_38;
  JSValueUnion d;
  
  JVar8 = js_thisNumberValue(ctx,this_val);
  d = JVar8.u;
  uVar6 = (uint)JVar8.tag;
  if (uVar6 == 6) {
    JVar3.float64 = -NAN;
  }
  else {
    iVar2 = 10;
    if (magic == 0) {
      iVar7 = argv->tag;
      uVar4 = (uint)iVar7;
      if (uVar4 != 3) {
        JVar3 = (JSValueUnion)(argv->u).ptr;
        if (0xfffffff4 < uVar4) {
          *(int *)JVar3.ptr = *JVar3.ptr + 1;
        }
        val.tag = iVar7;
        val.u.ptr = JVar3.ptr;
        iVar2 = JS_ToInt32SatFree(ctx,&local_3c,val);
        if (iVar2 == 0) {
          iVar2 = local_3c;
          if (0xffffffdc < local_3c - 0x25U) goto LAB_0016626e;
          JS_ThrowRangeError(ctx,"radix must be between 2 and 36");
        }
        if ((0xfffffff4 < uVar6) && (iVar2 = *d.ptr, *(int *)d.ptr = iVar2 + -1, iVar2 < 2)) {
          __JS_FreeValueRT(ctx->rt,JVar8);
        }
        d.float64 = 0.0;
        uVar5 = 0;
        iVar7 = 6;
        goto LAB_00166344;
      }
    }
LAB_0016626e:
    if (uVar6 < 3) {
      d.float64 = (double)JVar8.u._0_4_;
    }
    else if ((uVar6 != 7) &&
            (iVar1 = __JS_ToFloat64Free(ctx,&local_38.float64,JVar8), d = local_38, iVar1 != 0)) {
      iVar7 = 6;
      d.float64 = 0.0;
      uVar5 = 0;
      goto LAB_00166344;
    }
    JVar8 = js_dtoa(ctx,d.float64,iVar2,0,0);
    JVar3 = JVar8.u;
    JVar8.tag = JVar8.tag;
    JVar8.u.float64 = -NAN;
    d = JVar3;
  }
  iVar7 = JVar8.tag;
  uVar5 = (ulong)JVar8.u.ptr & (ulong)JVar3.ptr;
LAB_00166344:
  JVar9.u.ptr = (void *)((ulong)d.ptr & 0xffffffff | uVar5);
  JVar9.tag = iVar7;
  return JVar9;
}

Assistant:

static JSValue js_number_toString(JSContext *ctx, JSValueConst this_val,
                                  int argc, JSValueConst *argv, int magic)
{
    JSValue val;
    int base;
    double d;

    val = js_thisNumberValue(ctx, this_val);
    if (JS_IsException(val))
        return val;
    if (magic || JS_IsUndefined(argv[0])) {
        base = 10;
    } else {
        base = js_get_radix(ctx, argv[0]);
        if (base < 0)
            goto fail;
    }
    if (JS_ToFloat64Free(ctx, &d, val))
        return JS_EXCEPTION;
    return js_dtoa(ctx, d, base, 0, JS_DTOA_VAR_FORMAT);
 fail:
    JS_FreeValue(ctx, val);
    return JS_EXCEPTION;
}